

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cc
# Opt level: O0

void __thiscall lf::base::Timer::Stop(Timer *this)

{
  bool bVar1;
  type tVar2;
  undefined1 local_28 [8];
  cpu_times current;
  Timer *this_local;
  
  current.system.__r = (rep)this;
  bVar1 = IsStopped(this);
  if (!bVar1) {
    this->is_stopped_ = true;
    anon_unknown.dwarf_169141a::get_cpu_times((cpu_times *)local_28);
    tVar2 = std::chrono::operator-
                      ((duration<long,_std::ratio<1L,_1000000000L>_> *)local_28,
                       (duration<long,_std::ratio<1L,_1000000000L>_> *)this);
    (this->times_).wall.__r = tVar2.__r;
    tVar2 = std::chrono::operator-(&current.wall,&(this->times_).user);
    (this->times_).user.__r = tVar2.__r;
    tVar2 = std::chrono::operator-(&current.user,&(this->times_).system);
    (this->times_).system.__r = tVar2.__r;
  }
  return;
}

Assistant:

void Timer::Stop() noexcept {
  if (IsStopped()) {
    return;
  }
  is_stopped_ = true;

  cpu_times current;  // NOLINT
  get_cpu_times(&current);
  times_.wall = (current.wall - times_.wall);
  times_.user = (current.user - times_.user);
  times_.system = (current.system - times_.system);
}